

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O3

void __thiscall QNetworkAccessCache::timerEvent(QNetworkAccessCache *this,QTimerEvent *param_1)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  int *piVar4;
  char cVar5;
  QNetworkAccessCache *pQVar6;
  
  if (*(long *)(this + 0x18) != 0) {
    do {
      cVar5 = QDeadlineTimer::hasExpired();
      lVar1 = *(long *)(this + 0x18);
      if (cVar5 == '\0') {
        if (lVar1 != 0) {
          pQVar6 = (QNetworkAccessCache *)(lVar1 + 0x28);
          goto LAB_0017af6d;
        }
        break;
      }
      lVar2 = *(long *)(lVar1 + 0x30);
      (**(code **)(**(long **)(lVar1 + 0x38) + 0x10))();
      QHash<QByteArray,_QNetworkAccessCache::Node_*>::removeImpl<QByteArray>
                ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)(this + 0x10),
                 (QByteArray *)(*(long *)(this + 0x18) + 0x10));
      pvVar3 = *(void **)(this + 0x18);
      if ((pvVar3 != (void *)0x0) && (piVar4 = *(int **)((long)pvVar3 + 0x10), piVar4 != (int *)0x0)
         ) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)pvVar3 + 0x10),1,0x10);
        }
      }
      operator_delete(pvVar3,0x48);
      *(long *)(this + 0x18) = lVar2;
    } while (lVar2 != 0);
  }
  pQVar6 = this + 0x20;
LAB_0017af6d:
  *(undefined8 *)pQVar6 = 0;
  updateTimer(this);
  return;
}

Assistant:

void QNetworkAccessCache::timerEvent(QTimerEvent *)
{
    while (firstExpiringNode && firstExpiringNode->timer.hasExpired()) {
        Node *next = firstExpiringNode->next;
        firstExpiringNode->object->dispose();
        hash.remove(firstExpiringNode->key); // `firstExpiringNode` gets deleted
        delete firstExpiringNode;
        firstExpiringNode = next;
    }

    // fixup the list
    if (firstExpiringNode)
        firstExpiringNode->previous = nullptr;
    else
        lastExpiringNode = nullptr;

    updateTimer();
}